

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

bool __thiscall
wasm::ValidationInfo::shouldBeSubTypeIgnoringShared
          (ValidationInfo *this,Type left,Type right,Expression *curr,char *text,Function *func)

{
  Shareability SVar1;
  HeapType HVar2;
  ulong uVar3;
  bool bVar4;
  HeapType local_48;
  Type local_40;
  Type left_local;
  Type right_local;
  
  local_40.id = left.id;
  left_local.id = right.id;
  if ((6 < right.id) && ((right.id & 1) == 0)) {
    HVar2 = wasm::Type::getHeapType(&left_local);
    if (HVar2.id < 0x7d) {
      if ((left.id & 1) == 0 && 6 < left.id) {
        local_48 = wasm::Type::getHeapType(&local_40);
        SVar1 = HeapType::getShared(&local_48);
        bVar4 = SVar1 == Shared;
      }
      else {
        bVar4 = false;
      }
      HVar2 = wasm::Type::getHeapType(&left_local);
      if (0x7c < HVar2.id) {
        __assert_fail("isBasic()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0xe2,"BasicHeapType wasm::HeapType::getBasic(Shareability) const");
      }
      uVar3 = (ulong)((uint)HVar2.id & 0x7b);
      if (bVar4) {
        uVar3 = HVar2.id | 4;
      }
      if (((uint)(0x7c < uVar3) * 4 + 3 & (uint)uVar3) == 0) {
        bVar4 = wasm::Type::isSubType
                          (local_40,(Type)((uint)(((uint)left_local.id & 3) == 2 &&
                                                 6 < left_local.id) * 2 | uVar3));
        if (!bVar4) {
          fail<wasm::Expression*,char_const*>(this,text,curr,func);
        }
        return bVar4;
      }
      __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
    }
  }
  __assert_fail("right.isRef() && right.getHeapType().isBasic()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-validator.cpp"
                ,0xe5,
                "bool wasm::ValidationInfo::shouldBeSubTypeIgnoringShared(Type, Type, Expression *, const char *, Function *)"
               );
}

Assistant:

bool shouldBeSubTypeIgnoringShared(Type left,
                                     Type right,
                                     Expression* curr,
                                     const char* text,
                                     Function* func = nullptr) {
    assert(right.isRef() && right.getHeapType().isBasic());
    auto share = left.isRef() ? left.getHeapType().getShared() : Unshared;
    auto ht = right.getHeapType();
    auto matchedRight = Type(ht.getBasic(share), right.getNullability());
    return shouldBeSubType(left, matchedRight, curr, text, func);
  }